

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_hevc.c
# Opt level: O0

int decode_nal_units(HEVCContext *h,uint8_t *bs,uint64_t bs_len)

{
  uint8_t *puVar1;
  void *pvVar2;
  int iVar3;
  uint8_t **ppuVar4;
  int iVar5;
  bool bVar6;
  int local_d4;
  int local_d0;
  int di;
  int si;
  int rbsp_len;
  uint8_t *rbsp;
  int nalu_length;
  int ptr_bs_back;
  int ptr_bs;
  uint64_t bs_len_local;
  uint8_t *bs_local;
  HEVCContext *h_local;
  ulong local_90;
  int local_74;
  char diff;
  char *p;
  char *ptr;
  uint8_t *local_40;
  int ret;
  int buffer_size;
  
  nalu_length = 0;
  do {
    while (((ulong)(long)(nalu_length + 3) < bs_len &&
           (((bs[nalu_length] != '\0' || (bs[nalu_length + 1] != '\0')) ||
            (bs[nalu_length + 2] != '\x01'))))) {
      nalu_length = nalu_length + 1;
    }
    if (bs_len <= (ulong)(long)(nalu_length + 3)) {
      return 0;
    }
    h->nal_unit_type = (int)(bs[nalu_length + 3] & 0x7f) >> 1;
    iVar3 = nalu_length + 5;
    h->temporal_id = (bs[nalu_length + 4] & 7) - 1;
    rbsp._4_4_ = -1;
    nalu_length = iVar3;
    while ((ulong)(long)(nalu_length + 3) < bs_len) {
      if (bs[nalu_length] == '\0') {
        if ((nalu_length != iVar3) && (bs[nalu_length + -1] == '\0')) {
          nalu_length = nalu_length + -1;
        }
        if ((((ulong)(long)(nalu_length + 2) < bs_len) && (bs[nalu_length + 1] == '\0')) &&
           (bs[nalu_length + 2] < 4)) {
          if (bs[nalu_length + 2] != '\x03') {
            rbsp._4_4_ = nalu_length - iVar3;
          }
          break;
        }
        nalu_length = nalu_length + 2;
      }
      else {
        nalu_length = nalu_length + 2;
      }
    }
    _si = bs + iVar3;
    di = rbsp._4_4_;
    if (rbsp._4_4_ == -1) {
      ppuVar4 = &h->rbsp_buffer;
      local_90 = (bs_len - (long)iVar3) + 0x10;
      if (h->rbsp_buffer_size < local_90) {
        if (*ppuVar4 != (uint8_t *)0x0) {
          puVar1 = *ppuVar4;
          if (puVar1 != (uint8_t *)0x0) {
            free(puVar1 + -(long)(int)(char)puVar1[-1]);
          }
          *ppuVar4 = (uint8_t *)0x0;
        }
        if ((local_90 < 0x7fffffe0) && (local_90 != 0)) {
          pvVar2 = malloc((bs_len - (long)iVar3) + 0x30);
          if (pvVar2 == (void *)0x0) {
            local_40 = (uint8_t *)0x0;
          }
          else {
            local_40 = (uint8_t *)((long)pvVar2 + 0x20U & 0xffffffffffffffe0);
            local_40[-1] = (char)local_40 - (char)pvVar2;
          }
        }
        else {
          local_40 = (uint8_t *)0x0;
        }
        *ppuVar4 = local_40;
        if (*ppuVar4 == (uint8_t *)0x0) {
          local_90 = 0;
        }
        h->rbsp_buffer_size = local_90;
      }
      if (h->rbsp_buffer == (uint8_t *)0x0) {
        fprintf(_stderr,"Error Alloc memory for RBSP\n");
        return -1;
      }
      _si = h->rbsp_buffer;
      memcpy(_si,bs + iVar3,(long)(nalu_length - iVar3));
      local_d0 = nalu_length;
      local_d4 = nalu_length - iVar3;
      while ((ulong)(long)(local_d0 + 2) < bs_len) {
        if (bs[local_d0 + 2] < 4) {
          if ((bs[local_d0] != '\0') || (bs[local_d0 + 1] != '\0')) goto LAB_00109afb;
          if (bs[local_d0 + 2] != '\x03') goto LAB_00109b8e;
          iVar3 = local_d4 + 1;
          _si[local_d4] = '\0';
          local_d4 = local_d4 + 2;
          _si[iVar3] = '\0';
          local_d0 = local_d0 + 3;
        }
        else {
          iVar3 = local_d0 + 1;
          iVar5 = local_d4 + 1;
          _si[local_d4] = bs[local_d0];
          local_d0 = local_d0 + 2;
          local_d4 = local_d4 + 2;
          _si[iVar5] = bs[iVar3];
LAB_00109afb:
          _si[local_d4] = bs[local_d0];
          local_d4 = local_d4 + 1;
          local_d0 = local_d0 + 1;
        }
      }
      while ((ulong)(long)local_d0 < bs_len) {
        _si[local_d4] = bs[local_d0];
        local_d4 = local_d4 + 1;
        local_d0 = local_d0 + 1;
      }
LAB_00109b8e:
      di = local_d4;
      nalu_length = local_d0;
    }
    while( true ) {
      bVar6 = false;
      if (di != 0) {
        bVar6 = _si[di + -1] == '\0';
      }
      if (!bVar6) break;
      di = di + -1;
    }
    local_74 = di;
    if ((0xfffffff < di) || (di < 0)) {
      local_74 = -1;
    }
    ret = local_74 << 3;
    _buffer_size = _si;
    if (((0x7ffffff7 < ret) || (ret < 0)) || (_si == (uint8_t *)0x0)) {
      ret = 0;
      _buffer_size = (uint8_t *)0x0;
    }
    (h->gb).buffer = _buffer_size;
    (h->gb).size_in_bits = ret;
    (h->gb).size_in_bits_plus8 = ret + 8;
    (h->gb).buffer_end = _buffer_size + (ret + 7 >> 3);
    (h->gb).index = 0;
    decode_nal_unit(h);
  } while( true );
}

Assistant:

int decode_nal_units(HEVCContext *h, const uint8_t *bs, uint64_t bs_len)
{
    //decode all NAL units in an Access Unit
    int ptr_bs = 0;
    while(1)
    {
        //1. parse NAL start code
        while(ptr_bs + 3 < bs_len)
        {
            if(bs[ptr_bs] == 0 && bs[ptr_bs + 1] == 0 && bs[ptr_bs + 2] == 1)
                break;
            ptr_bs++;
        }
        if(ptr_bs + 3 >= bs_len)
            break;
        ptr_bs += 3;

        //2. NAL Unit header
        h->nal_unit_type = (enum NALUnitType)((bs[ptr_bs++] & 0x7F) >> 1);
        h->temporal_id = (bs[ptr_bs++] & 0x7) - 1;

        //3. Extract emulated code
        int ptr_bs_back = ptr_bs;
        int nalu_length = -1;
        while(ptr_bs + 3 < bs_len)
        {
            if(bs[ptr_bs])
            {
                ptr_bs += 2;
                continue;
            }
            if(ptr_bs != ptr_bs_back && !bs[ptr_bs - 1])
                ptr_bs--;
            if(ptr_bs + 2 < bs_len && bs[ptr_bs + 1] == 0 && bs[ptr_bs + 2] <= 3)
            {
                if(bs[ptr_bs + 2] != 3)
                    nalu_length = ptr_bs - ptr_bs_back;
                break;
            }
            ptr_bs += 2;
        }
        uint8_t *rbsp = (uint8_t *)(bs + ptr_bs_back);
        int rbsp_len = nalu_length;

        //4. Has 0x000003, very rare
        if(nalu_length == -1)
        {
            fd_fast_realloc((void **)&h->rbsp_buffer, &h->rbsp_buffer_size, bs_len - ptr_bs_back + 16);
            if(!h->rbsp_buffer)
            {
                fprintf(stderr, "Error Alloc memory for RBSP\n");
                return -1;
            }
            rbsp = h->rbsp_buffer;
            memcpy(rbsp, bs + ptr_bs_back, ptr_bs - ptr_bs_back);
            int si = ptr_bs;
            int di = ptr_bs - ptr_bs_back;
            while(si + 2 < bs_len)
            {
                if(bs[si + 2] > 3)
                {
                    rbsp[di++] = bs[si++];
                    rbsp[di++] = bs[si++];
                }
                else if(bs[si] == 0 && bs[si + 1] == 0)
                {
                    if(bs[si + 2] == 3)
                    {
                        rbsp[di++] = 0;
                        rbsp[di++] = 0;
                        si += 3;
                        continue;
                    }
                    goto nsc;
                }
                rbsp[di++] = bs[si++];
            }
            while(si < bs_len)
                rbsp[di++] = bs[si++];
nsc:
            rbsp_len = di;
            ptr_bs = si;
        }
//        for(int i = 0; i < rbsp_len; i++)
//            printf("%02x\n", rbsp[i]);

        while(rbsp_len && rbsp[rbsp_len - 1] == 0)
            rbsp_len--;
        //5. Initial get bits context
        init_get_bits8(&h->gb, rbsp, rbsp_len);

        //6. Decode this NAL Unit with this RBSP.
        decode_nal_unit(h);
    }
    return 0;
}